

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vodCoreException.h
# Opt level: O0

void __thiscall VodCoreException::~VodCoreException(VodCoreException *this)

{
  VodCoreException *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_errStr);
  return;
}

Assistant:

VodCoreException(const int errCode, std::string errStr) : m_errCode(errCode), m_errStr(std::move(errStr)) {}